

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Enum_Test::TestBody(PrintfTest_Enum_Test *this)

{
  string_view format;
  string_view format_00;
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char (*in_stack_fffffffffffffed8) [9];
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  char (*in_stack_fffffffffffffee8) [3];
  string *expected;
  char *in_stack_fffffffffffffef0;
  Message *in_stack_fffffffffffffef8;
  int line;
  Message *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff0c;
  Type type;
  AssertHelper *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff20 [12];
  undefined4 in_stack_ffffffffffffff2c;
  string local_c0 [24];
  Message *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult local_80 [3];
  undefined4 local_4c;
  AssertHelper local_38 [4];
  AssertionResult local_18;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             *in_stack_fffffffffffffed8);
  local_4c = 0x2a;
  this_00 = local_38;
  format.data_._7_1_ = in_stack_fffffffffffffee7;
  format.data_._0_7_ = in_stack_fffffffffffffee0;
  format.size_ = (size_t)in_stack_fffffffffffffee8;
  test_sprintf<E>(format,(E *)in_stack_fffffffffffffed8);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string((string *)local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff0c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_ffffffffffffff00 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                    in_stack_fffffffffffffed8);
    in_stack_fffffffffffffef8 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                    (char (*) [3])in_stack_fffffffffffffed8);
    in_stack_fffffffffffffef0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13754e);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_ffffffffffffff00,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x1375a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137600);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             *in_stack_fffffffffffffed8);
  expected = local_c0;
  format_00.size_._4_4_ = in_stack_ffffffffffffff2c;
  format_00._0_12_ = in_stack_ffffffffffffff20;
  make_positional_abi_cxx11_(format_00);
  fmt::v5::sprintf<std::__cxx11::string,E>(in_stack_ffffffffffffff18,(E *)this_00);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,(char (*) [3])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  line = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::__cxx11::string::~string(local_c0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x13773a);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_ffffffffffffff00,line,in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x137786);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1377d5);
  return;
}

Assistant:

TEST(PrintfTest, Enum) {
  EXPECT_PRINTF("42", "%d", A);
}